

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

expr_node * __thiscall expr_tree::pwrDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_node *peVar2;
  expr_value eStack_28;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,3);
  expr_node::expr_node(this_00,'\x05',&eStack_28);
  peVar1 = Copy(node->right);
  this_00->left = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,5);
  expr_node::expr_node(peVar1,'\x05',&eStack_28);
  this_00->right = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,2);
  expr_node::expr_node(peVar1,'\x05',&eStack_28);
  peVar2 = Copy(node->right);
  peVar1->left = peVar2;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,1);
  expr_node::expr_node(peVar2,'\x01',&eStack_28);
  peVar1->right = peVar2;
  Link(peVar1,peVar1->left,peVar2);
  this_00->right->right = peVar1;
  peVar2 = Copy(node->left);
  peVar1 = this_00->right;
  peVar1->left = peVar2;
  Link(peVar1,peVar2,peVar1->right);
  Link(this_00,this_00->left,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::pwrDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)MUL);
    deriv->left = Copy(node->right);
    deriv->right = new expr_node(OP, (long)PWR);
    auto new_pwr = new expr_node(OP, (long)SUB);
    new_pwr->left = Copy(node->right);
    new_pwr->right = new expr_node(INT, (long)1);
    Link(new_pwr, new_pwr->left, new_pwr->right);
    deriv->right->right = new_pwr;
    deriv->right->left = Copy(node->left);
    Link(deriv->right, deriv->right->left, deriv->right->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}